

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O2

void __thiscall
pybind11::exception<kratos::UserException>::exception
          (exception<kratos::UserException> *this,handle scope,char *name,handle base)

{
  bool bVar1;
  PyObject *pPVar2;
  undefined1 local_e0 [8];
  string full_name;
  object local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  undefined1 local_60 [16];
  undefined1 local_50 [16];
  char *local_40;
  char *name_local;
  
  (this->super_object).super_handle.m_ptr = (PyObject *)0x0;
  local_a8.super_handle.m_ptr = (handle)(PyObject *)0x0;
  local_40 = name;
  pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>::
  cast<std::__cxx11::string>
            (&local_80,
             (accessor<pybind11::detail::accessor_policies::str_attr> *)
             ((long)&full_name.field_2 + 8));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,".",(allocator<char> *)((long)&name_local + 7));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
                 &local_80,&local_a0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,name)
  ;
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_80);
  object::~object(&local_a8);
  pPVar2 = (PyObject *)PyErr_NewException(local_e0,base.m_ptr,0);
  (this->super_object).super_handle.m_ptr = pPVar2;
  bVar1 = hasattr(scope,"__dict__");
  if (bVar1) {
    local_50._0_8_ = "__dict__";
    local_50._8_8_ = 0;
    local_60._8_8_ = scope.m_ptr;
    bVar1 = pybind11::detail::
            object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>::
            contains<char_const*&>
                      ((object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>
                        *)local_60,&local_40);
    object::~object((object *)(local_50 + 8));
    name = local_40;
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(full_name.field_2._M_local_buf + 8),local_40,
                 (allocator<char> *)&local_a0);
      std::operator+(&local_80,
                     "Error during initialization: multiple incompatible definitions with name \"",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&full_name.field_2 + 8));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
                     &local_80,"\"");
      pybind11_fail((string *)local_60);
    }
  }
  local_50._8_8_ = 0;
  local_60._8_8_ = scope.m_ptr;
  local_50._0_8_ = name;
  pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>::operator=
            ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_60,this);
  object::~object((object *)(local_50 + 8));
  std::__cxx11::string::~string((string *)local_e0);
  return;
}

Assistant:

exception(handle scope, const char *name, handle base = PyExc_Exception) {
        std::string full_name = scope.attr("__name__").cast<std::string>() +
                                std::string(".") + name;
        m_ptr = PyErr_NewException(const_cast<char *>(full_name.c_str()), base.ptr(), NULL);
        if (hasattr(scope, "__dict__") && scope.attr("__dict__").contains(name))
            pybind11_fail("Error during initialization: multiple incompatible "
                          "definitions with name \"" + std::string(name) + "\"");
        scope.attr(name) = *this;
    }